

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise.cpp
# Opt level: O3

int __thiscall ncnn::ConvolutionDepthWise::load_model(ConvolutionDepthWise *this,ModelBin *mb)

{
  Mat *pMVar1;
  undefined4 uVar2;
  void *pvVar3;
  Allocator *pAVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int iVar8;
  uint uVar9;
  int *piVar10;
  long lVar11;
  ulong uVar12;
  size_t sVar13;
  Mat *pMVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  int iVar21;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  void *ptr;
  undefined1 local_88 [16];
  size_t local_78;
  int local_70;
  Allocator *local_68;
  undefined4 local_60;
  int iStack_5c;
  undefined8 uStack_58;
  size_t local_50;
  void *local_40;
  Mat *local_38;
  
  (**mb->_vptr_ModelBin)(local_88,mb,(ulong)(uint)this->weight_data_size,0);
  if (&this->weight_data != (Mat *)local_88) {
    if ((int *)local_88._8_8_ != (int *)0x0) {
      LOCK();
      *(int *)local_88._8_8_ = *(int *)local_88._8_8_ + 1;
      UNLOCK();
    }
    piVar10 = (this->weight_data).refcount;
    if (piVar10 != (int *)0x0) {
      LOCK();
      *piVar10 = *piVar10 + -1;
      UNLOCK();
      if (*piVar10 == 0) {
        pvVar3 = (this->weight_data).data;
        pAVar4 = (this->weight_data).allocator;
        if (pAVar4 == (Allocator *)0x0) {
          if (pvVar3 != (void *)0x0) {
            free(pvVar3);
          }
        }
        else {
          (**(code **)(*(long *)pAVar4 + 0x18))();
        }
      }
    }
    (this->weight_data).data = (void *)local_88._0_8_;
    (this->weight_data).refcount = (int *)local_88._8_8_;
    (this->weight_data).elemsize = local_78;
    (this->weight_data).packing = local_70;
    (this->weight_data).allocator = local_68;
    (this->weight_data).dims = local_60;
    (this->weight_data).w = iStack_5c;
    (this->weight_data).h = (undefined4)uStack_58;
    (this->weight_data).c = uStack_58._4_4_;
    (this->weight_data).cstep = local_50;
  }
  if ((int *)local_88._8_8_ != (int *)0x0) {
    LOCK();
    *(int *)local_88._8_8_ = *(int *)local_88._8_8_ + -1;
    UNLOCK();
    if (*(int *)local_88._8_8_ == 0) {
      if (local_68 == (Allocator *)0x0) {
        if ((void *)local_88._0_8_ != (void *)0x0) {
          free((void *)local_88._0_8_);
        }
      }
      else {
        (**(code **)(*(long *)local_68 + 0x18))();
      }
    }
  }
  if ((this->weight_data).data == (void *)0x0) {
    return -100;
  }
  if ((long)(this->weight_data).c * (this->weight_data).cstep == 0) {
    return -100;
  }
  if (this->bias_term != 0) {
    (**mb->_vptr_ModelBin)(local_88,mb,(ulong)(uint)this->num_output,1);
    if (&this->bias_data != (Mat *)local_88) {
      if ((int *)local_88._8_8_ != (int *)0x0) {
        LOCK();
        *(int *)local_88._8_8_ = *(int *)local_88._8_8_ + 1;
        UNLOCK();
      }
      piVar10 = (this->bias_data).refcount;
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + -1;
        UNLOCK();
        if (*piVar10 == 0) {
          pvVar3 = (this->bias_data).data;
          pAVar4 = (this->bias_data).allocator;
          if (pAVar4 == (Allocator *)0x0) {
            if (pvVar3 != (void *)0x0) {
              free(pvVar3);
            }
          }
          else {
            (**(code **)(*(long *)pAVar4 + 0x18))();
          }
        }
      }
      (this->bias_data).data = (void *)local_88._0_8_;
      (this->bias_data).refcount = (int *)local_88._8_8_;
      (this->bias_data).elemsize = local_78;
      (this->bias_data).packing = local_70;
      (this->bias_data).allocator = local_68;
      (this->bias_data).dims = local_60;
      (this->bias_data).w = iStack_5c;
      (this->bias_data).h = (undefined4)uStack_58;
      (this->bias_data).c = uStack_58._4_4_;
      (this->bias_data).cstep = local_50;
    }
    if ((int *)local_88._8_8_ != (int *)0x0) {
      LOCK();
      *(int *)local_88._8_8_ = *(int *)local_88._8_8_ + -1;
      UNLOCK();
      if (*(int *)local_88._8_8_ == 0) {
        if (local_68 == (Allocator *)0x0) {
          if ((void *)local_88._0_8_ != (void *)0x0) {
            free((void *)local_88._0_8_);
          }
        }
        else {
          (**(code **)(*(long *)local_68 + 0x18))();
        }
      }
    }
    if ((this->bias_data).data == (void *)0x0) {
      return -100;
    }
    if ((long)(this->bias_data).c * (this->bias_data).cstep == 0) {
      return -100;
    }
  }
  if (this->int8_scale_term == 2) {
    (**mb->_vptr_ModelBin)(local_88,mb,1,1);
    local_38 = &this->weight_data_int8_scales;
    if (local_38 != (Mat *)local_88) {
      if ((int *)local_88._8_8_ != (int *)0x0) {
        LOCK();
        *(int *)local_88._8_8_ = *(int *)local_88._8_8_ + 1;
        UNLOCK();
      }
      piVar10 = (this->weight_data_int8_scales).refcount;
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + -1;
        UNLOCK();
        if (*piVar10 == 0) {
          pvVar3 = (this->weight_data_int8_scales).data;
          pAVar4 = (this->weight_data_int8_scales).allocator;
          if (pAVar4 == (Allocator *)0x0) {
            if (pvVar3 != (void *)0x0) {
              free(pvVar3);
            }
          }
          else {
            (**(code **)(*(long *)pAVar4 + 0x18))();
          }
        }
      }
      (this->weight_data_int8_scales).data = (void *)local_88._0_8_;
      (this->weight_data_int8_scales).refcount = (int *)local_88._8_8_;
      (this->weight_data_int8_scales).elemsize = local_78;
      (this->weight_data_int8_scales).packing = local_70;
      (this->weight_data_int8_scales).allocator = local_68;
      (this->weight_data_int8_scales).dims = local_60;
      (this->weight_data_int8_scales).w = iStack_5c;
      (this->weight_data_int8_scales).h = (undefined4)uStack_58;
      (this->weight_data_int8_scales).c = uStack_58._4_4_;
      (this->weight_data_int8_scales).cstep = local_50;
    }
    if ((int *)local_88._8_8_ != (int *)0x0) {
      LOCK();
      *(int *)local_88._8_8_ = *(int *)local_88._8_8_ + -1;
      UNLOCK();
      if (*(int *)local_88._8_8_ == 0) {
        if (local_68 == (Allocator *)0x0) {
          if ((void *)local_88._0_8_ != (void *)0x0) {
            free((void *)local_88._0_8_);
          }
        }
        else {
          (**(code **)(*(long *)local_68 + 0x18))();
        }
      }
    }
    (**mb->_vptr_ModelBin)(local_88,mb,1,1);
    pMVar1 = &this->bottom_blob_int8_scales;
    if (pMVar1 != (Mat *)local_88) {
      if ((int *)local_88._8_8_ != (int *)0x0) {
        LOCK();
        *(int *)local_88._8_8_ = *(int *)local_88._8_8_ + 1;
        UNLOCK();
      }
      piVar10 = (this->bottom_blob_int8_scales).refcount;
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + -1;
        UNLOCK();
        if (*piVar10 == 0) {
          pvVar3 = (this->bottom_blob_int8_scales).data;
          pAVar4 = (this->bottom_blob_int8_scales).allocator;
          if (pAVar4 == (Allocator *)0x0) {
            if (pvVar3 != (void *)0x0) {
              free(pvVar3);
            }
          }
          else {
            (**(code **)(*(long *)pAVar4 + 0x18))();
          }
        }
      }
      (this->bottom_blob_int8_scales).data = (void *)local_88._0_8_;
      (this->bottom_blob_int8_scales).refcount = (int *)local_88._8_8_;
      (this->bottom_blob_int8_scales).elemsize = local_78;
      (this->bottom_blob_int8_scales).packing = local_70;
      (this->bottom_blob_int8_scales).allocator = local_68;
      (this->bottom_blob_int8_scales).dims = local_60;
      (this->bottom_blob_int8_scales).w = iStack_5c;
      (this->bottom_blob_int8_scales).h = (undefined4)uStack_58;
      (this->bottom_blob_int8_scales).c = uStack_58._4_4_;
      (this->bottom_blob_int8_scales).cstep = local_50;
    }
    if ((int *)local_88._8_8_ != (int *)0x0) {
      LOCK();
      *(int *)local_88._8_8_ = *(int *)local_88._8_8_ + -1;
      UNLOCK();
      if (*(int *)local_88._8_8_ == 0) {
        if (local_68 == (Allocator *)0x0) {
          if ((void *)local_88._0_8_ != (void *)0x0) {
            free((void *)local_88._0_8_);
          }
        }
        else {
          (**(code **)(*(long *)local_68 + 0x18))();
        }
      }
    }
    uVar2 = *(this->weight_data_int8_scales).data;
    iStack_5c = this->group;
    sVar13 = (size_t)iStack_5c;
    local_88 = (undefined1  [16])0x0;
    local_78 = 4;
    local_70 = 1;
    local_68 = (Allocator *)0x0;
    local_60 = 1;
    uStack_58 = 0x100000001;
    local_50 = sVar13;
    if (sVar13 == 0) {
      pMVar14 = local_38;
      if (local_38 != (Mat *)local_88) goto LAB_0014b3f0;
    }
    else {
      local_40 = (void *)0x0;
      iVar8 = posix_memalign(&local_40,0x10,sVar13 * 4 + 4);
      local_88._0_8_ = (void *)0x0;
      if (iVar8 == 0) {
        local_88._0_8_ = local_40;
      }
      piVar10 = (int *)(local_88._0_8_ + sVar13 * 4);
      local_88._8_8_ = piVar10;
      *piVar10 = 1;
      pMVar14 = local_38;
      if (local_38 != (Mat *)local_88) {
        LOCK();
        *piVar10 = *piVar10 + 1;
        UNLOCK();
LAB_0014b3f0:
        pMVar14 = local_38;
        piVar10 = (this->weight_data_int8_scales).refcount;
        if (piVar10 != (int *)0x0) {
          LOCK();
          *piVar10 = *piVar10 + -1;
          UNLOCK();
          if (*piVar10 == 0) {
            pvVar3 = (this->weight_data_int8_scales).data;
            pAVar4 = (this->weight_data_int8_scales).allocator;
            if (pAVar4 == (Allocator *)0x0) {
              if (pvVar3 != (void *)0x0) {
                free(pvVar3);
              }
            }
            else {
              (**(code **)(*(long *)pAVar4 + 0x18))();
            }
          }
        }
        (this->weight_data_int8_scales).data = (void *)local_88._0_8_;
        (this->weight_data_int8_scales).refcount = (int *)local_88._8_8_;
        (this->weight_data_int8_scales).elemsize = local_78;
        (this->weight_data_int8_scales).packing = local_70;
        (this->weight_data_int8_scales).allocator = local_68;
        (this->weight_data_int8_scales).dims = local_60;
        (this->weight_data_int8_scales).w = iStack_5c;
        (this->weight_data_int8_scales).h = (undefined4)uStack_58;
        (this->weight_data_int8_scales).c = uStack_58._4_4_;
        (this->weight_data_int8_scales).cstep = local_50;
        piVar10 = (int *)local_88._8_8_;
        if ((int *)local_88._8_8_ == (int *)0x0) goto LAB_0014b697;
      }
      LOCK();
      *piVar10 = *piVar10 + -1;
      UNLOCK();
      if (*piVar10 == 0) {
        if (local_68 == (Allocator *)0x0) {
          if ((void *)local_88._0_8_ != (void *)0x0) {
            free((void *)local_88._0_8_);
          }
        }
        else {
          (**(code **)(*(long *)local_68 + 0x18))();
        }
      }
    }
LAB_0014b697:
    auVar7 = _DAT_00163380;
    auVar6 = _DAT_00163370;
    auVar5 = _DAT_00162c50;
    uVar9 = (this->weight_data_int8_scales).c * (int)(this->weight_data_int8_scales).cstep;
    if (0 < (int)uVar9) {
      pvVar3 = pMVar14->data;
      lVar11 = (ulong)uVar9 - 1;
      auVar19._8_4_ = (int)lVar11;
      auVar19._0_8_ = lVar11;
      auVar19._12_4_ = (int)((ulong)lVar11 >> 0x20);
      uVar12 = 0;
      auVar19 = auVar19 ^ _DAT_00162c50;
      do {
        auVar17._8_4_ = (int)uVar12;
        auVar17._0_8_ = uVar12;
        auVar17._12_4_ = (int)(uVar12 >> 0x20);
        auVar20 = (auVar17 | auVar7) ^ auVar5;
        iVar8 = auVar19._4_4_;
        if ((bool)(~(auVar20._4_4_ == iVar8 && auVar19._0_4_ < auVar20._0_4_ ||
                    iVar8 < auVar20._4_4_) & 1)) {
          *(undefined4 *)((long)pvVar3 + uVar12 * 4) = uVar2;
        }
        if ((auVar20._12_4_ != auVar19._12_4_ || auVar20._8_4_ <= auVar19._8_4_) &&
            auVar20._12_4_ <= auVar19._12_4_) {
          *(undefined4 *)((long)pvVar3 + uVar12 * 4 + 4) = uVar2;
        }
        auVar17 = (auVar17 | auVar6) ^ auVar5;
        iVar21 = auVar17._4_4_;
        if (iVar21 <= iVar8 && (iVar21 != iVar8 || auVar17._0_4_ <= auVar19._0_4_)) {
          *(undefined4 *)((long)pvVar3 + uVar12 * 4 + 8) = uVar2;
          *(undefined4 *)((long)pvVar3 + uVar12 * 4 + 0xc) = uVar2;
        }
        uVar12 = uVar12 + 4;
      } while ((uVar9 + 3 & 0xfffffffc) != uVar12);
    }
    uVar2 = *(this->bottom_blob_int8_scales).data;
    iStack_5c = this->group;
    sVar13 = (size_t)iStack_5c;
    local_88 = (undefined1  [16])0x0;
    local_78 = 4;
    local_70 = 1;
    local_68 = (Allocator *)0x0;
    local_60 = 1;
    uStack_58 = 0x100000001;
    local_50 = sVar13;
    if (sVar13 == 0) {
      if (pMVar1 == (Mat *)local_88) goto LAB_0014b935;
LAB_0014b855:
      piVar10 = (this->bottom_blob_int8_scales).refcount;
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + -1;
        UNLOCK();
        if (*piVar10 == 0) {
          pvVar3 = (this->bottom_blob_int8_scales).data;
          pAVar4 = (this->bottom_blob_int8_scales).allocator;
          if (pAVar4 == (Allocator *)0x0) {
            if (pvVar3 != (void *)0x0) {
              free(pvVar3);
            }
          }
          else {
            (**(code **)(*(long *)pAVar4 + 0x18))();
          }
        }
      }
      (this->bottom_blob_int8_scales).data = (void *)local_88._0_8_;
      (this->bottom_blob_int8_scales).refcount = (int *)local_88._8_8_;
      (this->bottom_blob_int8_scales).elemsize = local_78;
      (this->bottom_blob_int8_scales).packing = local_70;
      (this->bottom_blob_int8_scales).allocator = local_68;
      (this->bottom_blob_int8_scales).dims = local_60;
      (this->bottom_blob_int8_scales).w = iStack_5c;
      (this->bottom_blob_int8_scales).h = (undefined4)uStack_58;
      (this->bottom_blob_int8_scales).c = uStack_58._4_4_;
      (this->bottom_blob_int8_scales).cstep = local_50;
      piVar10 = (int *)local_88._8_8_;
      if ((int *)local_88._8_8_ == (int *)0x0) goto LAB_0014b935;
    }
    else {
      local_40 = (void *)0x0;
      iVar8 = posix_memalign(&local_40,0x10,sVar13 * 4 + 4);
      local_88._0_8_ = (void *)0x0;
      if (iVar8 == 0) {
        local_88._0_8_ = local_40;
      }
      piVar10 = (int *)(local_88._0_8_ + sVar13 * 4);
      local_88._8_8_ = piVar10;
      *piVar10 = 1;
      if (pMVar1 != (Mat *)local_88) {
        LOCK();
        *piVar10 = *piVar10 + 1;
        UNLOCK();
        goto LAB_0014b855;
      }
    }
    LOCK();
    *piVar10 = *piVar10 + -1;
    UNLOCK();
    if (*piVar10 == 0) {
      if (local_68 == (Allocator *)0x0) {
        if ((void *)local_88._0_8_ != (void *)0x0) {
          free((void *)local_88._0_8_);
        }
      }
      else {
        (**(code **)(*(long *)local_68 + 0x18))();
      }
    }
LAB_0014b935:
    auVar7 = _DAT_00163380;
    auVar6 = _DAT_00163370;
    auVar5 = _DAT_00162c50;
    uVar9 = (this->bottom_blob_int8_scales).c * (int)(this->bottom_blob_int8_scales).cstep;
    if (0 < (int)uVar9) {
      pvVar3 = pMVar1->data;
      lVar11 = (ulong)uVar9 - 1;
      auVar20._8_4_ = (int)lVar11;
      auVar20._0_8_ = lVar11;
      auVar20._12_4_ = (int)((ulong)lVar11 >> 0x20);
      uVar12 = 0;
      auVar20 = auVar20 ^ _DAT_00162c50;
      do {
        auVar18._8_4_ = (int)uVar12;
        auVar18._0_8_ = uVar12;
        auVar18._12_4_ = (int)(uVar12 >> 0x20);
        auVar19 = (auVar18 | auVar7) ^ auVar5;
        iVar8 = auVar20._4_4_;
        if ((bool)(~(auVar19._4_4_ == iVar8 && auVar20._0_4_ < auVar19._0_4_ ||
                    iVar8 < auVar19._4_4_) & 1)) {
          *(undefined4 *)((long)pvVar3 + uVar12 * 4) = uVar2;
        }
        if ((auVar19._12_4_ != auVar20._12_4_ || auVar19._8_4_ <= auVar20._8_4_) &&
            auVar19._12_4_ <= auVar20._12_4_) {
          *(undefined4 *)((long)pvVar3 + uVar12 * 4 + 4) = uVar2;
        }
        auVar19 = (auVar18 | auVar6) ^ auVar5;
        iVar21 = auVar19._4_4_;
        if (iVar21 <= iVar8 && (iVar21 != iVar8 || auVar19._0_4_ <= auVar20._0_4_)) {
          *(undefined4 *)((long)pvVar3 + uVar12 * 4 + 8) = uVar2;
          *(undefined4 *)((long)pvVar3 + uVar12 * 4 + 0xc) = uVar2;
        }
        uVar12 = uVar12 + 4;
      } while ((uVar9 + 3 & 0xfffffffc) != uVar12);
      return 0;
    }
    return 0;
  }
  if (this->int8_scale_term != 1) {
    return 0;
  }
  (**mb->_vptr_ModelBin)(local_88,mb,(ulong)(uint)this->group,1);
  if (&this->weight_data_int8_scales != (Mat *)local_88) {
    if ((int *)local_88._8_8_ != (int *)0x0) {
      LOCK();
      *(int *)local_88._8_8_ = *(int *)local_88._8_8_ + 1;
      UNLOCK();
    }
    piVar10 = (this->weight_data_int8_scales).refcount;
    if (piVar10 != (int *)0x0) {
      LOCK();
      *piVar10 = *piVar10 + -1;
      UNLOCK();
      if (*piVar10 == 0) {
        pvVar3 = (this->weight_data_int8_scales).data;
        pAVar4 = (this->weight_data_int8_scales).allocator;
        if (pAVar4 == (Allocator *)0x0) {
          if (pvVar3 != (void *)0x0) {
            free(pvVar3);
          }
        }
        else {
          (**(code **)(*(long *)pAVar4 + 0x18))();
        }
      }
    }
    (this->weight_data_int8_scales).data = (void *)local_88._0_8_;
    (this->weight_data_int8_scales).refcount = (int *)local_88._8_8_;
    (this->weight_data_int8_scales).elemsize = local_78;
    (this->weight_data_int8_scales).packing = local_70;
    (this->weight_data_int8_scales).allocator = local_68;
    (this->weight_data_int8_scales).dims = local_60;
    (this->weight_data_int8_scales).w = iStack_5c;
    (this->weight_data_int8_scales).h = (undefined4)uStack_58;
    (this->weight_data_int8_scales).c = uStack_58._4_4_;
    (this->weight_data_int8_scales).cstep = local_50;
  }
  if ((int *)local_88._8_8_ != (int *)0x0) {
    LOCK();
    *(int *)local_88._8_8_ = *(int *)local_88._8_8_ + -1;
    UNLOCK();
    if (*(int *)local_88._8_8_ == 0) {
      if (local_68 == (Allocator *)0x0) {
        if ((void *)local_88._0_8_ != (void *)0x0) {
          free((void *)local_88._0_8_);
        }
      }
      else {
        (**(code **)(*(long *)local_68 + 0x18))();
      }
    }
  }
  (**mb->_vptr_ModelBin)(local_88,mb,1,1);
  pMVar1 = &this->bottom_blob_int8_scales;
  if (pMVar1 != (Mat *)local_88) {
    if ((int *)local_88._8_8_ != (int *)0x0) {
      LOCK();
      *(int *)local_88._8_8_ = *(int *)local_88._8_8_ + 1;
      UNLOCK();
    }
    piVar10 = (this->bottom_blob_int8_scales).refcount;
    if (piVar10 != (int *)0x0) {
      LOCK();
      *piVar10 = *piVar10 + -1;
      UNLOCK();
      if (*piVar10 == 0) {
        pvVar3 = (this->bottom_blob_int8_scales).data;
        pAVar4 = (this->bottom_blob_int8_scales).allocator;
        if (pAVar4 == (Allocator *)0x0) {
          if (pvVar3 != (void *)0x0) {
            free(pvVar3);
          }
        }
        else {
          (**(code **)(*(long *)pAVar4 + 0x18))();
        }
      }
    }
    (this->bottom_blob_int8_scales).data = (void *)local_88._0_8_;
    (this->bottom_blob_int8_scales).refcount = (int *)local_88._8_8_;
    (this->bottom_blob_int8_scales).elemsize = local_78;
    (this->bottom_blob_int8_scales).packing = local_70;
    (this->bottom_blob_int8_scales).allocator = local_68;
    (this->bottom_blob_int8_scales).dims = local_60;
    (this->bottom_blob_int8_scales).w = iStack_5c;
    (this->bottom_blob_int8_scales).h = (undefined4)uStack_58;
    (this->bottom_blob_int8_scales).c = uStack_58._4_4_;
    (this->bottom_blob_int8_scales).cstep = local_50;
  }
  if ((int *)local_88._8_8_ != (int *)0x0) {
    LOCK();
    *(int *)local_88._8_8_ = *(int *)local_88._8_8_ + -1;
    UNLOCK();
    if (*(int *)local_88._8_8_ == 0) {
      if (local_68 == (Allocator *)0x0) {
        if ((void *)local_88._0_8_ != (void *)0x0) {
          free((void *)local_88._0_8_);
        }
      }
      else {
        (**(code **)(*(long *)local_68 + 0x18))();
      }
    }
  }
  uVar2 = *(this->bottom_blob_int8_scales).data;
  iStack_5c = this->group;
  sVar13 = (size_t)iStack_5c;
  local_88 = (undefined1  [16])0x0;
  local_78 = 4;
  local_70 = 1;
  local_68 = (Allocator *)0x0;
  local_60 = 1;
  uStack_58 = 0x100000001;
  local_50 = sVar13;
  if (sVar13 == 0) {
    if (pMVar1 == (Mat *)local_88) goto LAB_0014b4e5;
LAB_0014b24e:
    piVar10 = (this->bottom_blob_int8_scales).refcount;
    if (piVar10 != (int *)0x0) {
      LOCK();
      *piVar10 = *piVar10 + -1;
      UNLOCK();
      if (*piVar10 == 0) {
        pvVar3 = (this->bottom_blob_int8_scales).data;
        pAVar4 = (this->bottom_blob_int8_scales).allocator;
        if (pAVar4 == (Allocator *)0x0) {
          if (pvVar3 != (void *)0x0) {
            free(pvVar3);
          }
        }
        else {
          (**(code **)(*(long *)pAVar4 + 0x18))();
        }
      }
    }
    (this->bottom_blob_int8_scales).data = (void *)local_88._0_8_;
    (this->bottom_blob_int8_scales).refcount = (int *)local_88._8_8_;
    (this->bottom_blob_int8_scales).elemsize = local_78;
    (this->bottom_blob_int8_scales).packing = local_70;
    (this->bottom_blob_int8_scales).allocator = local_68;
    (this->bottom_blob_int8_scales).dims = local_60;
    (this->bottom_blob_int8_scales).w = iStack_5c;
    (this->bottom_blob_int8_scales).h = (undefined4)uStack_58;
    (this->bottom_blob_int8_scales).c = uStack_58._4_4_;
    (this->bottom_blob_int8_scales).cstep = local_50;
    piVar10 = (int *)local_88._8_8_;
    if ((int *)local_88._8_8_ == (int *)0x0) goto LAB_0014b4e5;
  }
  else {
    local_40 = (void *)0x0;
    iVar8 = posix_memalign(&local_40,0x10,sVar13 * 4 + 4);
    local_88._0_8_ = (void *)0x0;
    if (iVar8 == 0) {
      local_88._0_8_ = local_40;
    }
    piVar10 = (int *)(sVar13 * 4 + local_88._0_8_);
    local_88._8_8_ = piVar10;
    *piVar10 = 1;
    if (pMVar1 != (Mat *)local_88) {
      LOCK();
      *piVar10 = *piVar10 + 1;
      UNLOCK();
      goto LAB_0014b24e;
    }
  }
  LOCK();
  *piVar10 = *piVar10 + -1;
  UNLOCK();
  if (*piVar10 == 0) {
    if (local_68 == (Allocator *)0x0) {
      if ((void *)local_88._0_8_ != (void *)0x0) {
        free((void *)local_88._0_8_);
      }
    }
    else {
      (**(code **)(*(long *)local_68 + 0x18))();
    }
  }
LAB_0014b4e5:
  auVar7 = _DAT_00163380;
  auVar6 = _DAT_00163370;
  auVar5 = _DAT_00162c50;
  uVar9 = (this->bottom_blob_int8_scales).c * (int)(this->bottom_blob_int8_scales).cstep;
  if (0 < (int)uVar9) {
    pvVar3 = pMVar1->data;
    lVar11 = (ulong)uVar9 - 1;
    auVar15._8_4_ = (int)lVar11;
    auVar15._0_8_ = lVar11;
    auVar15._12_4_ = (int)((ulong)lVar11 >> 0x20);
    uVar12 = 0;
    auVar15 = auVar15 ^ _DAT_00162c50;
    do {
      auVar16._8_4_ = (int)uVar12;
      auVar16._0_8_ = uVar12;
      auVar16._12_4_ = (int)(uVar12 >> 0x20);
      auVar19 = (auVar16 | auVar7) ^ auVar5;
      iVar8 = auVar15._4_4_;
      if ((bool)(~(auVar19._4_4_ == iVar8 && auVar15._0_4_ < auVar19._0_4_ || iVar8 < auVar19._4_4_)
                & 1)) {
        *(undefined4 *)((long)pvVar3 + uVar12 * 4) = uVar2;
      }
      if ((auVar19._12_4_ != auVar15._12_4_ || auVar19._8_4_ <= auVar15._8_4_) &&
          auVar19._12_4_ <= auVar15._12_4_) {
        *(undefined4 *)((long)pvVar3 + uVar12 * 4 + 4) = uVar2;
      }
      auVar19 = (auVar16 | auVar6) ^ auVar5;
      iVar21 = auVar19._4_4_;
      if (iVar21 <= iVar8 && (iVar21 != iVar8 || auVar19._0_4_ <= auVar15._0_4_)) {
        *(undefined4 *)((long)pvVar3 + uVar12 * 4 + 8) = uVar2;
        *(undefined4 *)((long)pvVar3 + uVar12 * 4 + 0xc) = uVar2;
      }
      uVar12 = uVar12 + 4;
    } while ((uVar9 + 3 & 0xfffffffc) != uVar12);
    return 0;
  }
  return 0;
}

Assistant:

int ConvolutionDepthWise::load_model(const ModelBin& mb)
{
    weight_data = mb.load(weight_data_size, 0);
    if (weight_data.empty())
        return -100;

    if (bias_term)
    {
        bias_data = mb.load(num_output, 1);
        if (bias_data.empty())
            return -100;
    }

    if (int8_scale_term == 1)
    {
        weight_data_int8_scales = mb.load(group, 1);
        bottom_blob_int8_scales = mb.load(1, 1);

        float bottom_blob_int8_scale = bottom_blob_int8_scales[0];
        bottom_blob_int8_scales = Mat(group);
        bottom_blob_int8_scales.fill(bottom_blob_int8_scale);
    }
    else if (int8_scale_term == 2)
    {
        weight_data_int8_scales = mb.load(1, 1);
        bottom_blob_int8_scales = mb.load(1, 1);

        // extend group if only one provided
        float weight_data_int8_scale = weight_data_int8_scales[0];
        weight_data_int8_scales = Mat(group);
        weight_data_int8_scales.fill(weight_data_int8_scale);

        float bottom_blob_int8_scale = bottom_blob_int8_scales[0];
        bottom_blob_int8_scales = Mat(group);
        bottom_blob_int8_scales.fill(bottom_blob_int8_scale);
    }

    return 0;
}